

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O3

Cnf_Dat_t * Cnf_DeriveFastClauses(Aig_Man_t *p,int nOutputs)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  Aig_Obj_t *pRoot;
  bool bVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *p_00;
  Vec_Int_t *vMap;
  ulong uVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Vec_Ptr_t *pVVar11;
  Vec_Int_t *vCover;
  Vec_Int_t *vClauses;
  Cnf_Dat_t *pCVar12;
  int **ppiVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int Entry;
  Vec_Int_t *p_01;
  int iVar17;
  ulong uVar18;
  
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x10000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(0x40000);
  pVVar6->pArray = piVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x1000;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(0x4000);
  p_00->pArray = piVar7;
  pVVar9 = p->vObjs;
  uVar1 = pVVar9->nSize;
  uVar18 = (ulong)uVar1;
  vMap = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar5 = uVar1;
  }
  vMap->nCap = uVar5;
  if (uVar5 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)(int)uVar5 << 2);
  }
  vMap->pArray = piVar7;
  vMap->nSize = uVar1;
  memset(piVar7,0xff,(long)(int)uVar1 * 4);
  uVar8 = uVar18;
  if (nOutputs == 0) {
LAB_0050700a:
    iVar17 = 1;
    if (0 < (int)uVar1) goto LAB_00507018;
  }
  else {
    if (p->nRegs == 0) {
      if (p->nObjs[3] != nOutputs) {
        __assert_fail("nOutputs == Aig_ManCoNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                      ,0x234,"Cnf_Dat_t *Cnf_DeriveFastClauses(Aig_Man_t *, int)");
      }
      pVVar11 = p->vCos;
      if (pVVar11->nSize < 1) goto LAB_0050700a;
      ppvVar10 = pVVar11->pArray;
      lVar14 = 0;
      do {
        iVar17 = *(int *)((long)ppvVar10[lVar14] + 0x24);
        if (((long)iVar17 < 0) || ((int)uVar1 <= iVar17)) goto LAB_00507513;
        lVar14 = lVar14 + 1;
        piVar7[iVar17] = (int)lVar14;
      } while (lVar14 < pVVar11->nSize);
      iVar17 = (int)lVar14 + 1;
    }
    else {
      if (p->nRegs != nOutputs) {
        __assert_fail("nOutputs == Aig_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                      ,0x23a,"Cnf_Dat_t *Cnf_DeriveFastClauses(Aig_Man_t *, int)");
      }
      uVar5 = p->nObjs[3] - nOutputs;
      pVVar11 = p->vCos;
      if (pVVar11->nSize <= (int)uVar5) goto LAB_0050700a;
      uVar15 = (ulong)uVar5;
      iVar17 = 1;
      do {
        if ((int)uVar5 < 0) goto LAB_005074d5;
        iVar2 = *(int *)((long)pVVar11->pArray[uVar15] + 0x24);
        if (((long)iVar2 < 0) || ((int)uVar1 <= iVar2)) goto LAB_00507513;
        piVar7[iVar2] = iVar17;
        iVar17 = iVar17 + 1;
        uVar15 = uVar15 + 1;
      } while ((int)uVar15 < pVVar11->nSize);
    }
LAB_00507018:
    do {
      if ((long)(int)uVar1 < (long)uVar8) goto LAB_005074d5;
      pvVar3 = pVVar9->pArray[uVar8 - 1];
      if (((pvVar3 != (void *)0x0) && ((*(ulong *)((long)pvVar3 + 0x18) & 0x10) != 0)) &&
         (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7)) {
        iVar2 = *(int *)((long)pvVar3 + 0x24);
        if (((long)iVar2 < 0) || ((int)uVar1 <= iVar2)) goto LAB_00507513;
        piVar7[iVar2] = iVar17;
        iVar17 = iVar17 + 1;
      }
      bVar4 = 1 < uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar4);
  }
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    ppvVar10 = pVVar9->pArray;
    lVar14 = 0;
    do {
      iVar2 = *(int *)((long)ppvVar10[lVar14] + 0x24);
      if (((long)iVar2 < 0) || ((int)uVar1 <= iVar2)) goto LAB_00507513;
      piVar7[iVar2] = iVar17 + (int)lVar14;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar9->nSize);
    iVar17 = iVar17 + (int)lVar14;
  }
  iVar2 = p->pConst1->Id;
  if (((long)iVar2 < 0) || ((int)uVar1 <= iVar2)) {
LAB_00507513:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  piVar7[iVar2] = iVar17;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  ppvVar10 = (void **)malloc(800);
  pVVar9->pArray = ppvVar10;
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  ppvVar10 = (void **)malloc(800);
  pVVar11->pArray = ppvVar10;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar7 = (int *)malloc(0x40000);
  vCover->pArray = piVar7;
  vClauses = (Vec_Int_t *)malloc(0x10);
  vClauses->nCap = 100;
  vClauses->nSize = 0;
  piVar7 = (int *)malloc(400);
  vClauses->pArray = piVar7;
  do {
    if ((long)p->vObjs->nSize < (long)uVar18) {
LAB_005074d5:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pRoot = (Aig_Obj_t *)p->vObjs->pArray[uVar18 - 1];
    if (((pRoot != (Aig_Obj_t *)0x0) && ((*(ulong *)&pRoot->field_0x18 & 0x10) != 0)) &&
       (0xfffffffd < ((uint)*(ulong *)&pRoot->field_0x18 & 7) - 7)) {
      Cnf_ComputeClauses(p,pRoot,pVVar9,pVVar11,vMap,vCover,vClauses);
      iVar2 = vClauses->nSize;
      if (0 < (long)iVar2) {
        piVar7 = vClauses->pArray;
        lVar14 = 0;
        do {
          Entry = piVar7[lVar14];
          p_01 = pVVar6;
          if (Entry == 0) {
            Entry = pVVar6->nSize;
            p_01 = p_00;
          }
          Vec_IntPush(p_01,Entry);
          lVar14 = lVar14 + 1;
        } while (iVar2 != lVar14);
      }
    }
    bVar4 = 1 < (long)uVar18;
    uVar18 = uVar18 - 1;
  } while (bVar4);
  if (pVVar9->pArray != (void **)0x0) {
    free(pVVar9->pArray);
  }
  free(pVVar9);
  if (pVVar11->pArray != (void **)0x0) {
    free(pVVar11->pArray);
  }
  free(pVVar11);
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
  }
  free(vCover);
  if (vClauses->pArray != (int *)0x0) {
    free(vClauses->pArray);
  }
  free(vClauses);
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      uVar18 = *(ulong *)((long)pVVar9->pArray[lVar14] + 8);
      iVar2 = *(int *)((uVar18 & 0xfffffffffffffffe) + 0x24);
      if (((long)iVar2 < 0) || (vMap->nSize <= iVar2)) goto LAB_005074f4;
      iVar2 = vMap->pArray[iVar2];
      if (iVar2 < 1) goto LAB_00507532;
      uVar1 = ((uint)uVar18 & 1) + iVar2 * 2;
      if (lVar14 < (long)p->nObjs[3] - (long)nOutputs) {
        Vec_IntPush(p_00,pVVar6->nSize);
      }
      else {
        uVar5 = *(uint *)((long)pVVar9->pArray[lVar14] + 0x24);
        if (((long)(int)uVar5 < 0) || ((uint)vMap->nSize <= uVar5)) goto LAB_005074f4;
        iVar2 = vMap->pArray[(int)uVar5];
        if (iVar2 < 1) goto LAB_00507532;
        Vec_IntPush(p_00,pVVar6->nSize);
        Vec_IntPush(pVVar6,iVar2 * 2);
        Vec_IntPush(pVVar6,uVar1 ^ 1);
        Vec_IntPush(p_00,pVVar6->nSize);
        Vec_IntPush(pVVar6,iVar2 * 2 + 1);
      }
      Vec_IntPush(pVVar6,uVar1);
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCos;
    } while (lVar14 < pVVar9->nSize);
  }
  iVar2 = p->pConst1->Id;
  if (((long)iVar2 < 0) || (vMap->nSize <= iVar2)) {
LAB_005074f4:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = vMap->pArray[iVar2];
  if (iVar2 < 1) {
LAB_00507532:
    __assert_fail("iSatVar > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                  ,0xb7,"int Cnf_ObjGetLit(Vec_Int_t *, Aig_Obj_t *, int)");
  }
  Vec_IntPush(p_00,pVVar6->nSize);
  Vec_IntPush(pVVar6,iVar2 * 2);
  pCVar12 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar12->pMan = p;
  pCVar12->nVars = iVar17 + 1;
  iVar17 = pVVar6->nSize;
  pCVar12->nLiterals = iVar17;
  lVar14 = (long)p_00->nSize;
  pCVar12->nClauses = p_00->nSize;
  ppiVar13 = (int **)malloc(lVar14 * 8 + 8);
  pCVar12->pClauses = ppiVar13;
  piVar7 = pVVar6->pArray;
  *ppiVar13 = piVar7;
  if (0 < lVar14) {
    piVar7 = p_00->pArray;
    lVar16 = 0;
    do {
      ppiVar13[lVar16] = *ppiVar13 + piVar7[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar14 != lVar16);
    piVar7 = *ppiVar13;
  }
  ppiVar13[lVar14] = piVar7 + iVar17;
  piVar7 = vMap->pArray;
  vMap->nCap = 0;
  vMap->nSize = 0;
  vMap->pArray = (int *)0x0;
  pCVar12->pVarNums = piVar7;
  free(pVVar6);
  pVVar6 = p_00;
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    pVVar6 = (Vec_Int_t *)vMap->pArray;
    free(p_00);
    if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_005074b9;
  }
  free(pVVar6);
LAB_005074b9:
  free(vMap);
  return pCVar12;
}

Assistant:

Cnf_Dat_t * Cnf_DeriveFastClauses( Aig_Man_t * p, int nOutputs )
{
    Cnf_Dat_t * pCnf;
    Vec_Int_t * vLits, * vClas, * vMap, * vTemp;
    Vec_Ptr_t * vLeaves, * vNodes;
    Vec_Int_t * vCover;
    Aig_Obj_t * pObj;
    int i, k, nVars, Entry, OutLit, DriLit;

    vLits = Vec_IntAlloc( 1 << 16 );
    vClas = Vec_IntAlloc( 1 << 12 );
    vMap  = Vec_IntStartFull( Aig_ManObjNumMax(p) );

    // assign variables for the outputs
    nVars = 1;
    if ( nOutputs )
    {
        if ( Aig_ManRegNum(p) == 0 )
        {
            assert( nOutputs == Aig_ManCoNum(p) );
            Aig_ManForEachCo( p, pObj, i )
                Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
        }
        else
        {
            assert( nOutputs == Aig_ManRegNum(p) );
            Aig_ManForEachLiSeq( p, pObj, i )
                Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
        }
    }
    // assign variables to the internal nodes
    Aig_ManForEachNodeReverse( p, pObj, i )
        if ( pObj->fMarkA )
            Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
    // assign variables to the PIs and constant node
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
    Vec_IntWriteEntry( vMap, Aig_ObjId(Aig_ManConst1(p)), nVars++ );

    // create clauses
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes  = Vec_PtrAlloc( 100 );
    vCover  = Vec_IntAlloc( 1 << 16 );
    vTemp   = Vec_IntAlloc( 100 );
    Aig_ManForEachNodeReverse( p, pObj, i )
    {
        if ( !pObj->fMarkA )
            continue;
        Cnf_ComputeClauses( p, pObj, vLeaves, vNodes, vMap, vCover, vTemp );
        Vec_IntForEachEntry( vTemp, Entry, k )
        {
            if ( Entry == 0 )
                Vec_IntPush( vClas, Vec_IntSize(vLits) );
            else
                Vec_IntPush( vLits, Entry );
        }       
    }
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vCover );
    Vec_IntFree( vTemp );

    // create clauses for the outputs
    Aig_ManForEachCo( p, pObj, i )
    {
        DriLit = Cnf_ObjGetLit( vMap, Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj) );
        if ( i < Aig_ManCoNum(p) - nOutputs )
        {
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, DriLit );
        }
        else
        {
            OutLit = Cnf_ObjGetLit( vMap, pObj, 0 );
            // first clause
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, OutLit );
            Vec_IntPush( vLits, DriLit ^ 1 );
            // second clause
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, OutLit ^ 1 );
            Vec_IntPush( vLits, DriLit );
        }
    }
 
    // write the constant literal
    OutLit = Cnf_ObjGetLit( vMap, Aig_ManConst1(p), 0 );
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    Vec_IntPush( vLits, OutLit );

    // create structure
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p;
    pCnf->nVars = nVars;
    pCnf->nLiterals = Vec_IntSize( vLits );
    pCnf->nClauses  = Vec_IntSize( vClas );
    pCnf->pClauses  = ABC_ALLOC( int *, pCnf->nClauses + 1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray( vLits );
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[pCnf->nClauses] = pCnf->pClauses[0] + pCnf->nLiterals;
    pCnf->pVarNums  = Vec_IntReleaseArray( vMap );

    // cleanup
    Vec_IntFree( vLits );
    Vec_IntFree( vClas );
    Vec_IntFree( vMap );
    return pCnf;
}